

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::MessagePattern::autoQuoteApostropheDeep
          (UnicodeString *__return_storage_ptr__,MessagePattern *this)

{
  char cVar1;
  Part *pPVar2;
  long lVar3;
  ulong uVar4;
  
  cVar1 = this->needsAutoQuoting;
  UnicodeString::UnicodeString(__return_storage_ptr__,&this->msg);
  if (cVar1 != '\0') {
    uVar4 = (ulong)(uint)this->partsLength;
    lVar3 = uVar4 * 0x10 + -6;
    for (; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
      pPVar2 = this->parts;
      if (*(int *)((long)pPVar2 + lVar3 + -10) == 3) {
        UnicodeString::insert
                  (__return_storage_ptr__,*(int32_t *)((long)pPVar2 + lVar3 + -6),
                   *(char16_t *)((long)&pPVar2->type + lVar3));
      }
      lVar3 = lVar3 + -0x10;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
MessagePattern::autoQuoteApostropheDeep() const {
    if(!needsAutoQuoting) {
        return msg;
    }
    UnicodeString modified(msg);
    // Iterate backward so that the insertion indexes do not change.
    int32_t count=countParts();
    for(int32_t i=count; i>0;) {
        const Part &part=getPart(--i);
        if(part.getType()==UMSGPAT_PART_TYPE_INSERT_CHAR) {
           modified.insert(part.index, (UChar)part.value);
        }
    }
    return modified;
}